

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.h
# Opt level: O2

bool __thiscall Diligent::ShaderCreateInfo::operator==(ShaderCreateInfo *this,ShaderCreateInfo *RHS)

{
  void *__s1;
  void *__s2;
  bool bVar1;
  int iVar2;
  
  bVar1 = SafeStrEqual(this->FilePath,RHS->FilePath);
  if (((bVar1) && (bVar1 = SafeStrEqual(this->Source,RHS->Source), bVar1)) &&
     ((this->field_4).SourceLength == (RHS->field_4).SourceLength)) {
    __s1 = this->ByteCode;
    __s2 = RHS->ByteCode;
    if ((__s2 != (void *)0x0) == (__s1 != (void *)0x0)) {
      if ((__s1 != (void *)0x0 && __s2 != (void *)0x0) &&
         (iVar2 = bcmp(__s1,__s2,(this->field_4).SourceLength), iVar2 != 0)) {
        return false;
      }
      bVar1 = SafeStrEqual(this->EntryPoint,RHS->EntryPoint);
      if (((((bVar1) && (bVar1 = ShaderMacroArray::operator!=(&this->Macros,&RHS->Macros), !bVar1))
           && ((bVar1 = ShaderDesc::operator!=(&this->Desc,&RHS->Desc), !bVar1 &&
               (((this->SourceLanguage == RHS->SourceLanguage &&
                 (this->ShaderCompiler == RHS->ShaderCompiler)) &&
                ((this->HLSLVersion).Major == (RHS->HLSLVersion).Major)))))) &&
          (((this->HLSLVersion).Minor == (RHS->HLSLVersion).Minor &&
           ((this->GLSLVersion).Major == (RHS->GLSLVersion).Major)))) &&
         (((this->GLSLVersion).Minor == (RHS->GLSLVersion).Minor &&
          ((((this->GLESSLVersion).Major == (RHS->GLESSLVersion).Major &&
            ((this->GLESSLVersion).Minor == (RHS->GLESSLVersion).Minor)) &&
           (((this->MSLVersion).Major == (RHS->MSLVersion).Major &&
            (((((this->MSLVersion).Minor == (RHS->MSLVersion).Minor &&
               (this->CompileFlags == RHS->CompileFlags)) &&
              (this->LoadConstantBufferReflection == RHS->LoadConstantBufferReflection)) &&
             (bVar1 = SafeStrEqual(this->GLSLExtensions,RHS->GLSLExtensions), bVar1)))))))))) {
        bVar1 = SafeStrEqual(this->WebGPUEmulatedArrayIndexSuffix,
                             RHS->WebGPUEmulatedArrayIndexSuffix);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool operator==(const ShaderCreateInfo& RHS) const noexcept
    {
        const auto& CI1 = *this;
        const auto& CI2 = RHS;

        if (!SafeStrEqual(CI1.FilePath, CI2.FilePath))
            return false;

        //if (CI1.FilePath != nullptr && CI1.pShaderSourceStreamFactory != CI2.pShaderSourceStreamFactory)
        //    return false;

        if (!SafeStrEqual(CI1.Source, CI2.Source))
            return false;

        if (CI1.SourceLength != CI2.SourceLength)
            return false;

        if ((CI1.ByteCode != nullptr) != (CI2.ByteCode != nullptr))
            return false;

        if ((CI1.ByteCode != nullptr) && (CI2.ByteCode != nullptr))
        {
            if (memcmp(CI1.ByteCode, CI2.ByteCode, CI1.ByteCodeSize) != 0)
                return false;
        }

        if (!SafeStrEqual(CI1.EntryPoint, CI2.EntryPoint))
            return false;

        if (CI1.Macros != CI2.Macros)
            return false;

        if (CI1.Desc != CI2.Desc)
            return false;

        if (CI1.SourceLanguage != CI2.SourceLanguage)
            return false;

        if (CI1.ShaderCompiler != CI2.ShaderCompiler)
            return false;

        if ((CI1.HLSLVersion != CI2.HLSLVersion ||
             CI1.GLSLVersion != CI2.GLSLVersion ||
             CI1.GLESSLVersion != CI2.GLESSLVersion ||
             CI1.MSLVersion != CI2.MSLVersion))
            return false;

        if (CI1.CompileFlags != CI2.CompileFlags)
            return false;

        if (CI1.LoadConstantBufferReflection != CI2.LoadConstantBufferReflection)
            return false;

        if (!SafeStrEqual(CI1.GLSLExtensions, CI2.GLSLExtensions))
            return false;

        if (!SafeStrEqual(CI1.WebGPUEmulatedArrayIndexSuffix, CI2.WebGPUEmulatedArrayIndexSuffix))
            return false;

        return true;
    }